

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O3

bool __thiscall EmmyFacade::PipeConnect(EmmyFacade *this,lua_State *L,string *name,string *err)

{
  bool bVar1;
  shared_ptr<PipelineClientTransporter> p;
  undefined1 local_51;
  PipelineClientTransporter *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  Destroy(this);
  EmmyDebuggerManager::AddDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffc0,
             (lua_State *)&this->_emmyDebuggerManager);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (*lua_sethook)(L,ReadyLuaHook,7,0);
  local_50 = (PipelineClientTransporter *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<PipelineClientTransporter,std::allocator<PipelineClientTransporter>>
            (&local_48,&local_50,(allocator<PipelineClientTransporter> *)&local_51);
  (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_50->super_Transporter;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_48);
  bVar1 = PipelineClientTransporter::Connect(local_50,name,err);
  if (bVar1) {
    WaitIDE(this,true,0);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  return bVar1;
}

Assistant:

bool EmmyFacade::PipeConnect(lua_State *L, const std::string &name, std::string &err) {
	Destroy();

	_emmyDebuggerManager.AddDebugger(L);

	SetReadyHook(L);

	const auto p = std::make_shared<PipelineClientTransporter>();
	transporter = p;
	// p->SetHandler(shared_from_this());
	const auto suc = p->Connect(name, err);
	if (suc) {
		WaitIDE(true);
	}
	return suc;
}